

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# empty_validity.hpp
# Opt level: O2

void duckdb::EmptyValidityCompression::Compress
               (CompressionState *state_p,Vector *scan_vector,idx_t count)

{
  idx_t iVar1;
  UnifiedVectorFormat format;
  UnifiedVectorFormat UStack_68;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&UStack_68);
  Vector::ToUnifiedFormat(scan_vector,count,&UStack_68);
  iVar1 = TemplatedValidityMask<unsigned_long>::CountValid
                    (&UStack_68.validity.super_TemplatedValidityMask<unsigned_long>,count);
  state_p[2].info.block_manager =
       (BlockManager *)((long)&(state_p[2].info.block_manager)->_vptr_BlockManager + iVar1);
  state_p[2]._vptr_CompressionState =
       (_func_int **)((long)state_p[2]._vptr_CompressionState + count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&UStack_68);
  return;
}

Assistant:

static void Compress(CompressionState &state_p, Vector &scan_vector, idx_t count) {
		auto &state = state_p.Cast<EmptyValidityCompressionState>();
		UnifiedVectorFormat format;
		scan_vector.ToUnifiedFormat(count, format);
		state.non_nulls += format.validity.CountValid(count);
		state.count += count;
	}